

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Surface.h
# Opt level: O0

Vector * __thiscall
anurbs::Surface<3L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<3L>_>_>::point_at
          (Vector *__return_storage_ptr__,
          Surface<3L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<3L>_>_> *this,double u,double v)

{
  element_type *peVar1;
  shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_> local_38;
  double local_28;
  double v_local;
  double u_local;
  Surface<3L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<3L>_>_> *this_local;
  
  local_28 = v;
  v_local = u;
  u_local = (double)this;
  this_local = (Surface<3L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<3L>_>_> *)
               __return_storage_ptr__;
  Ref<anurbs::NurbsSurfaceGeometry<3L>_>::operator->
            ((Ref<anurbs::NurbsSurfaceGeometry<3L>_> *)&local_38);
  peVar1 = std::
           __shared_ptr_access<anurbs::NurbsSurfaceGeometry<3L>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<anurbs::NurbsSurfaceGeometry<3L>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&local_38);
  (*(peVar1->super_SurfaceBase<3L>)._vptr_SurfaceBase[6])(v_local,local_28,__return_storage_ptr__);
  std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>::~shared_ptr(&local_38);
  return __return_storage_ptr__;
}

Assistant:

Vector point_at(const double u, const double v) const override
    {
        return m_surface_geometry->point_at(u, v);
    }